

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

void __thiscall Threadpool<Searchthread>::thread_func(Threadpool<Searchthread> *this)

{
  bool bVar1;
  reference __x;
  int local_5c;
  undefined1 local_58 [8];
  value_type fn;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Threadpool<Searchthread> *this_local;
  
  lock._8_8_ = this;
  do {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m);
    std::condition_variable::wait<Threadpool<Searchthread>::thread_func()::_lambda()_1_>
              (&this->cv_task,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
    bVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::empty
                      (&this->tasks);
    if (bVar1) {
      bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->stop);
      if (!bVar1) goto LAB_00173ed9;
      local_5c = 3;
    }
    else {
      std::__atomic_base<unsigned_int>::operator++(&(this->busy).super___atomic_base<unsigned_int>);
      __x = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::front
                      (&this->tasks);
      std::function<void_()>::function((function<void_()> *)local_58,__x);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&this->tasks);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
      std::function<void_()>::operator()((function<void_()> *)local_58);
      std::__atomic_base<unsigned_int>::operator++
                (&(this->processed).super___atomic_base<unsigned_int>);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
      std::__atomic_base<unsigned_int>::operator--(&(this->busy).super___atomic_base<unsigned_int>);
      std::condition_variable::notify_one();
      std::function<void_()>::~function((function<void_()> *)local_58);
LAB_00173ed9:
      local_5c = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
    if (local_5c != 0) {
      return;
    }
  } while( true );
}

Assistant:

void thread_func() {
		while (true) {
			std::unique_lock<std::mutex> lock(m);
			cv_task.wait(lock, [this]() { return stop || !tasks.empty(); });
			if (!tasks.empty()) {
				++busy;
				auto fn = tasks.front();
				tasks.pop_front();
				lock.unlock();
				fn();
				++processed;
				lock.lock();
				--busy;
				cv_finished.notify_one();
			}
			else if (stop) break;
		}
	}